

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::cast_from_variable_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  BaseType expr_type_00;
  string sStack_48;
  
  if ((expr_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    return;
  }
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (pSVar4 != (SPIRVariable *)0x0) {
    source_id = (pSVar4->super_IVariant).self.id;
  }
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  if (!bVar2) {
    return;
  }
  uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  expr_type_00 = Int;
  if (uVar3 < 0x2c) {
    if ((0xc00001406e0U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_0027554a;
    if ((0x3f000000UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_0027550f;
LAB_0027552a:
    expr_type_00 = UInt;
  }
  else {
LAB_0027550f:
    uVar1 = uVar3 - 0x14ae;
    if (uVar1 < 0x3a) {
      if ((0x200000006000007U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0027552a;
      if ((ulong)uVar1 == 0x21) goto LAB_0027554a;
    }
    if (((0x14 < uVar3 - 0x1148) || ((0x100107U >> (uVar3 - 0x1148 & 0x1f) & 1) == 0)) &&
       (uVar3 != 0x1396)) {
      return;
    }
  }
LAB_0027554a:
  if (expr_type_00 != *(BaseType *)&(expr_type->super_IVariant).field_0xc) {
    bitcast_expression(&sStack_48,this,expr_type,expr_type_00,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&sStack_48);
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

bool empty() const SPIRV_CROSS_NOEXCEPT
	{
		return buffer_size == 0;
	}